

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int emit_esni_extension(st_ptls_esni_secret_t *esni,ptls_buffer_t *buf,ptls_iovec_t esni_keys,
                       char *server_name,size_t key_share_ch_off,size_t key_share_ch_len)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uVar5;
  ptls_aead_context_t *ppVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t bytes_to_pad;
  ulong uVar11;
  size_t delta;
  ptls_aead_context_t *aead;
  ptls_aead_context_t *local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = (ptls_aead_context_t *)0x0;
  iVar7 = create_esni_aead(&local_48,1,(esni->field_3).client.cipher,esni->secret,
                           esni->esni_contents_hash);
  if (iVar7 == 0) {
    uVar1 = ((esni->field_3).client.cipher)->id;
    local_38 = esni_keys.len;
    iVar7 = ptls_buffer_reserve(buf,2);
    if (iVar7 == 0) {
      *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
      buf->off = buf->off + 2;
      iVar7 = push_key_share_entry
                        (buf,((esni->field_3).client.key_share)->id,(esni->field_3).client.pubkey);
      if ((iVar7 == 0) && (iVar7 = ptls_buffer_reserve(buf,2), iVar7 == 0)) {
        puVar2 = buf->base;
        sVar3 = buf->off;
        (puVar2 + sVar3)[0] = '\0';
        (puVar2 + sVar3)[1] = '\0';
        sVar3 = buf->off;
        buf->off = sVar3 + 2;
        iVar7 = ptls_buffer__do_pushv
                          (buf,(void *)((long)&esni->field_3 + 0x20),
                           ((esni->field_3).client.cipher)->hash->digest_size);
        if (iVar7 == 0) {
          lVar10 = buf->off - (sVar3 + 2);
          buf->base[sVar3] = (uint8_t)((ulong)lVar10 >> 8);
          buf->base[sVar3 + 1] = (uint8_t)lVar10;
          iVar7 = ptls_buffer_reserve(buf,2);
          if (iVar7 == 0) {
            puVar2 = buf->base;
            sVar3 = buf->off;
            (puVar2 + sVar3)[0] = '\0';
            (puVar2 + sVar3)[1] = '\0';
            sVar3 = buf->off;
            buf->off = sVar3 + 2;
            iVar7 = ptls_buffer_reserve(buf,0x10);
            if (iVar7 == 0) {
              puVar2 = buf->base;
              sVar4 = buf->off;
              uVar5 = *(undefined8 *)(esni->nonce + 8);
              *(undefined8 *)(puVar2 + sVar4) = *(undefined8 *)esni->nonce;
              *(undefined8 *)(puVar2 + sVar4 + 8) = uVar5;
              buf->off = buf->off + 0x10;
              local_40 = sVar3 + 2;
              iVar7 = emit_server_name_extension(buf,(char *)esni_keys.base);
              sVar4 = local_40;
              if (iVar7 == 0) {
                uVar8 = buf->off - local_40;
                uVar11 = (ulong)(esni->field_3).client.padded_length + 0x10;
                delta = uVar11 - uVar8;
                if (uVar8 <= uVar11 && delta != 0) {
                  iVar7 = ptls_buffer_reserve(buf,delta);
                  if (iVar7 != 0) goto LAB_0010f86a;
                  memset(buf->base + buf->off,0,delta);
                  buf->off = buf->off + delta;
                }
                ppVar6 = local_48;
                iVar7 = ptls_buffer_reserve(buf,local_48->algo->tag_size);
                if (iVar7 == 0) {
                  puVar2 = buf->base + sVar4;
                  iVar7 = 0;
                  ptls_aead_encrypt(ppVar6,puVar2,puVar2,buf->off - sVar4,0,buf->base + local_38,
                                    (size_t)server_name);
                  sVar9 = buf->off + ppVar6->algo->tag_size;
                  buf->off = sVar9;
                  lVar10 = sVar9 - sVar4;
                  buf->base[sVar3] = (uint8_t)((ulong)lVar10 >> 8);
                  buf->base[sVar3 + 1] = (uint8_t)lVar10;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010f86a:
  ppVar6 = local_48;
  if (local_48 != (st_ptls_aead_context_t *)0x0) {
    (*local_48->dispose_crypto)(local_48);
    (*ptls_clear_memory)(ppVar6->static_iv,ppVar6->algo->iv_size);
    free(ppVar6);
  }
  return iVar7;
}

Assistant:

static int emit_esni_extension(struct st_ptls_esni_secret_t *esni, ptls_buffer_t *buf, ptls_iovec_t esni_keys,
                               const char *server_name, size_t key_share_ch_off, size_t key_share_ch_len)
{
    ptls_aead_context_t *aead = NULL;
    int ret;

    if ((ret = create_esni_aead(&aead, 1, esni->client.cipher, esni->secret, esni->esni_contents_hash)) != 0)
        goto Exit;

    /* cipher-suite id */
    ptls_buffer_push16(buf, esni->client.cipher->id);
    /* key-share */
    if ((ret = push_key_share_entry(buf, esni->client.key_share->id, esni->client.pubkey)) != 0)
        goto Exit;
    /* record-digest */
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, esni->client.record_digest, esni->client.cipher->hash->digest_size); });
    /* encrypted sni */
    ptls_buffer_push_block(buf, 2, {
        size_t start_off = buf->off;
        /* nonce */
        ptls_buffer_pushv(buf, esni->nonce, PTLS_ESNI_NONCE_SIZE);
        /* emit server-name extension */
        if ((ret = emit_server_name_extension(buf, server_name)) != 0)
            goto Exit;
        /* pad */
        if (buf->off - start_off < (size_t)(esni->client.padded_length + PTLS_ESNI_NONCE_SIZE)) {
            size_t bytes_to_pad = esni->client.padded_length + PTLS_ESNI_NONCE_SIZE - (buf->off - start_off);
            if ((ret = ptls_buffer_reserve(buf, bytes_to_pad)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, bytes_to_pad);
            buf->off += bytes_to_pad;
        }
        /* encrypt */
        if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
            goto Exit;
        ptls_aead_encrypt(aead, buf->base + start_off, buf->base + start_off, buf->off - start_off, 0, buf->base + key_share_ch_off,
                          key_share_ch_len);
        buf->off += aead->algo->tag_size;
    });

    ret = 0;
Exit:
    if (aead != NULL)
        ptls_aead_free(aead);
    return ret;
}